

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# newtonmin.c
# Opt level: O2

void fdjac(custom_gradient *funcgrad,double *x,int N,double *jac,double *dx,double eps2,double *J)

{
  double *__ptr;
  double *pdVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  double dVar5;
  double x_00;
  
  __ptr = (double *)malloc((long)N * 8);
  uVar3 = 0;
  uVar4 = 0;
  if (0 < N) {
    uVar4 = (ulong)(uint)N;
  }
  for (; uVar3 != uVar4; uVar3 = uVar3 + 1) {
    x_00 = x[uVar3];
    dVar5 = x_00;
    if (ABS(x_00) < 1.0 / ABS(dx[uVar3])) {
      dVar5 = signx(x_00);
      x_00 = x[uVar3];
      dVar5 = dVar5 / ABS(dx[uVar3]);
    }
    dVar5 = dVar5 * eps2 + x_00;
    x[uVar3] = dVar5;
    (*funcgrad->funcgrad)(x,N,__ptr,funcgrad->params);
    pdVar1 = J;
    for (uVar2 = 0; uVar4 != uVar2; uVar2 = uVar2 + 1) {
      *pdVar1 = (__ptr[uVar2] - jac[uVar2]) / (dVar5 - x_00);
      pdVar1 = pdVar1 + N;
    }
    x[uVar3] = x_00;
    J = J + 1;
  }
  free(__ptr);
  return;
}

Assistant:

void fdjac(custom_gradient *funcgrad, double *x, int N, double *jac, double *dx, double eps2, double *J) {
	int i,j;
	double stepsize,temp,stepmax;
	double *fj;

	fj = (double*) malloc(sizeof(double) *N);

	for(j = 0; j < N;++j) {

		if (fabs(x[j]) >= (1.0 / fabs(dx[j]))) {
			stepmax = x[j];
		} else {
			stepmax = signx(x[j]) * 1.0 / fabs(dx[j]);
		}

		stepsize = eps2 * stepmax;
		temp = x[j];
		x[j] += stepsize;
		stepsize = x[j] - temp;
		FUNCGRAD_EVAL(funcgrad, x, N, fj);

		for(i = 0;i < N;++i) {
			J[i*N+j] = (fj[i] - jac[i]) / stepsize;
		}
		x[j] = temp;

	}

	free(fj);
}